

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void TrueMotion_SSE2(uint8_t *dst,int size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint8_t *ptr;
  int in_ESI;
  uint8_t *in_RDI;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  __m128i out_3;
  __m128i out_1;
  __m128i out_0;
  __m128i base_2;
  int val_2;
  __m128i top_base_1;
  __m128i top_base_0;
  __m128i top_values_2;
  __m128i out_2;
  __m128i base_1;
  int val_1;
  __m128i top_base_2;
  __m128i top_values_1;
  __m128i out;
  __m128i base;
  int val;
  __m128i top_base;
  __m128i top_values;
  int y;
  __m128i zero;
  uint8_t *top;
  short local_2ec;
  int local_2bc;
  uint8_t *local_298;
  ushort uStack_266;
  ushort uStack_264;
  ushort uStack_262;
  ushort uStack_25e;
  ushort uStack_25c;
  ushort uStack_25a;
  ushort uStack_246;
  ushort uStack_244;
  ushort uStack_242;
  ushort uStack_23e;
  ushort uStack_23c;
  ushort uStack_23a;
  ushort uStack_226;
  ushort uStack_224;
  ushort uStack_222;
  ushort uStack_21e;
  ushort uStack_21c;
  ushort uStack_21a;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  byte local_1a8;
  byte bStack_1a7;
  byte bStack_1a6;
  byte bStack_1a5;
  byte bStack_1a4;
  byte bStack_1a3;
  byte bStack_1a2;
  byte bStack_1a1;
  byte local_188;
  byte bStack_187;
  byte bStack_186;
  byte bStack_185;
  byte bStack_184;
  byte bStack_183;
  byte bStack_182;
  byte bStack_181;
  byte local_168;
  byte bStack_167;
  byte bStack_166;
  byte bStack_165;
  byte bStack_10;
  byte bStack_f;
  byte bStack_e;
  byte bStack_d;
  byte bStack_c;
  byte bStack_b;
  byte bStack_a;
  byte bStack_9;
  
  ptr = in_RDI + -0x20;
  local_298 = in_RDI;
  if (in_ESI == 4) {
    uVar3 = WebPMemToUint32(ptr);
    local_168 = (byte)uVar3;
    bStack_167 = (byte)(uVar3 >> 8);
    bStack_166 = (byte)(uVar3 >> 0x10);
    bStack_165 = (byte)(uVar3 >> 0x18);
    for (local_2bc = 0; local_2bc < 4; local_2bc = local_2bc + 1) {
      local_2ec = (ushort)local_298[-1] - (ushort)in_RDI[-0x21];
      uStack_206 = (ushort)bStack_167;
      uStack_204 = (ushort)bStack_166;
      uStack_202 = (ushort)bStack_165;
      sVar12 = local_2ec + (ushort)local_168;
      sVar13 = local_2ec + uStack_206;
      sVar14 = local_2ec + uStack_204;
      local_2ec = local_2ec + uStack_202;
      WebPUint32ToMem(local_298,
                      CONCAT13((0 < local_2ec) * (local_2ec < 0x100) * (char)local_2ec -
                               (0xff < local_2ec),
                               CONCAT12((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                        (0xff < sVar14),
                                        CONCAT11((0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 -
                                                 (0xff < sVar13),
                                                 (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 -
                                                 (0xff < sVar12)))));
      local_298 = local_298 + 0x20;
    }
  }
  else if (in_ESI == 8) {
    uVar1 = *(undefined8 *)ptr;
    local_188 = (byte)uVar1;
    bStack_187 = (byte)((ulong)uVar1 >> 8);
    bStack_186 = (byte)((ulong)uVar1 >> 0x10);
    bStack_185 = (byte)((ulong)uVar1 >> 0x18);
    bStack_184 = (byte)((ulong)uVar1 >> 0x20);
    bStack_183 = (byte)((ulong)uVar1 >> 0x28);
    bStack_182 = (byte)((ulong)uVar1 >> 0x30);
    bStack_181 = (byte)((ulong)uVar1 >> 0x38);
    for (local_2bc = 0; local_2bc < 8; local_2bc = local_2bc + 1) {
      sVar12 = (ushort)local_298[-1] - (ushort)in_RDI[-0x21];
      uStack_226 = (ushort)bStack_187;
      uStack_224 = (ushort)bStack_186;
      uStack_222 = (ushort)bStack_185;
      uStack_21e = (ushort)bStack_183;
      uStack_21c = (ushort)bStack_182;
      uStack_21a = (ushort)bStack_181;
      sVar13 = sVar12 + (ushort)local_188;
      sVar14 = sVar12 + uStack_226;
      sVar15 = sVar12 + uStack_224;
      sVar16 = sVar12 + uStack_222;
      sVar17 = sVar12 + (ushort)bStack_184;
      sVar18 = sVar12 + uStack_21e;
      sVar19 = sVar12 + uStack_21c;
      sVar12 = sVar12 + uStack_21a;
      *(ulong *)local_298 =
           CONCAT17((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12),
                    CONCAT16((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19),
                             CONCAT15((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 -
                                      (0xff < sVar18),
                                      CONCAT14((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 -
                                               (0xff < sVar17),
                                               CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                        (char)sVar16 - (0xff < sVar16),
                                                        CONCAT12((0 < sVar15) * (sVar15 < 0x100) *
                                                                 (char)sVar15 - (0xff < sVar15),
                                                                 CONCAT11((0 < sVar14) *
                                                                          (sVar14 < 0x100) *
                                                                          (char)sVar14 -
                                                                          (0xff < sVar14),
                                                                          (0 < sVar13) *
                                                                          (sVar13 < 0x100) *
                                                                          (char)sVar13 -
                                                                          (0xff < sVar13))))))));
      local_298 = local_298 + 0x20;
    }
  }
  else {
    uVar1 = *(undefined8 *)ptr;
    uVar2 = *(undefined8 *)(in_RDI + -0x18);
    local_1a8 = (byte)uVar1;
    bStack_1a7 = (byte)((ulong)uVar1 >> 8);
    bStack_1a6 = (byte)((ulong)uVar1 >> 0x10);
    bStack_1a5 = (byte)((ulong)uVar1 >> 0x18);
    bStack_1a4 = (byte)((ulong)uVar1 >> 0x20);
    bStack_1a3 = (byte)((ulong)uVar1 >> 0x28);
    bStack_1a2 = (byte)((ulong)uVar1 >> 0x30);
    bStack_1a1 = (byte)((ulong)uVar1 >> 0x38);
    bStack_10 = (byte)uVar2;
    bStack_f = (byte)((ulong)uVar2 >> 8);
    bStack_e = (byte)((ulong)uVar2 >> 0x10);
    bStack_d = (byte)((ulong)uVar2 >> 0x18);
    bStack_c = (byte)((ulong)uVar2 >> 0x20);
    bStack_b = (byte)((ulong)uVar2 >> 0x28);
    bStack_a = (byte)((ulong)uVar2 >> 0x30);
    bStack_9 = (byte)((ulong)uVar2 >> 0x38);
    for (local_2bc = 0; local_2bc < 0x10; local_2bc = local_2bc + 1) {
      sVar12 = (ushort)local_298[-1] - (ushort)in_RDI[-0x21];
      uStack_246 = (ushort)bStack_1a7;
      uStack_244 = (ushort)bStack_1a6;
      uStack_242 = (ushort)bStack_1a5;
      uStack_23e = (ushort)bStack_1a3;
      uStack_23c = (ushort)bStack_1a2;
      uStack_23a = (ushort)bStack_1a1;
      sVar13 = sVar12 + (ushort)local_1a8;
      sVar15 = sVar12 + uStack_246;
      sVar17 = sVar12 + uStack_244;
      sVar19 = sVar12 + uStack_242;
      sVar5 = sVar12 + (ushort)bStack_1a4;
      sVar7 = sVar12 + uStack_23e;
      sVar9 = sVar12 + uStack_23c;
      sVar11 = sVar12 + uStack_23a;
      uStack_266 = (ushort)bStack_f;
      uStack_264 = (ushort)bStack_e;
      uStack_262 = (ushort)bStack_d;
      uStack_25e = (ushort)bStack_b;
      uStack_25c = (ushort)bStack_a;
      uStack_25a = (ushort)bStack_9;
      sVar14 = sVar12 + (ushort)bStack_10;
      sVar16 = sVar12 + uStack_266;
      sVar18 = sVar12 + uStack_264;
      sVar4 = sVar12 + uStack_262;
      sVar6 = sVar12 + (ushort)bStack_c;
      sVar8 = sVar12 + uStack_25e;
      sVar10 = sVar12 + uStack_25c;
      sVar12 = sVar12 + uStack_25a;
      *(ulong *)local_298 =
           CONCAT17((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11),
                    CONCAT16((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                             CONCAT15((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7),
                                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) * (char)sVar5 -
                                               (0xff < sVar5),
                                               CONCAT13((0 < sVar19) * (sVar19 < 0x100) *
                                                        (char)sVar19 - (0xff < sVar19),
                                                        CONCAT12((0 < sVar17) * (sVar17 < 0x100) *
                                                                 (char)sVar17 - (0xff < sVar17),
                                                                 CONCAT11((0 < sVar15) *
                                                                          (sVar15 < 0x100) *
                                                                          (char)sVar15 -
                                                                          (0xff < sVar15),
                                                                          (0 < sVar13) *
                                                                          (sVar13 < 0x100) *
                                                                          (char)sVar13 -
                                                                          (0xff < sVar13))))))));
      *(ulong *)(local_298 + 8) =
           CONCAT17((0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12),
                    CONCAT16((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                             CONCAT15((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8),
                                      CONCAT14((0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 -
                                               (0xff < sVar6),
                                               CONCAT13((0 < sVar4) * (sVar4 < 0x100) * (char)sVar4
                                                        - (0xff < sVar4),
                                                        CONCAT12((0 < sVar18) * (sVar18 < 0x100) *
                                                                 (char)sVar18 - (0xff < sVar18),
                                                                 CONCAT11((0 < sVar16) *
                                                                          (sVar16 < 0x100) *
                                                                          (char)sVar16 -
                                                                          (0xff < sVar16),
                                                                          (0 < sVar14) *
                                                                          (sVar14 < 0x100) *
                                                                          (char)sVar14 -
                                                                          (0xff < sVar14))))))));
      local_298 = local_298 + 0x20;
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* dst, int size) {
  const uint8_t* top = dst - BPS;
  const __m128i zero = _mm_setzero_si128();
  int y;
  if (size == 4) {
    const __m128i top_values = _mm_cvtsi32_si128(WebPMemToUint32(top));
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 4; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      WebPUint32ToMem(dst, _mm_cvtsi128_si32(out));
    }
  } else if (size == 8) {
    const __m128i top_values = _mm_loadl_epi64((const __m128i*)top);
    const __m128i top_base = _mm_unpacklo_epi8(top_values, zero);
    for (y = 0; y < 8; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out = _mm_packus_epi16(_mm_add_epi16(base, top_base), zero);
      _mm_storel_epi64((__m128i*)dst, out);
    }
  } else {
    const __m128i top_values = _mm_loadu_si128((const __m128i*)top);
    const __m128i top_base_0 = _mm_unpacklo_epi8(top_values, zero);
    const __m128i top_base_1 = _mm_unpackhi_epi8(top_values, zero);
    for (y = 0; y < 16; ++y, dst += BPS) {
      const int val = dst[-1] - top[-1];
      const __m128i base = _mm_set1_epi16(val);
      const __m128i out_0 = _mm_add_epi16(base, top_base_0);
      const __m128i out_1 = _mm_add_epi16(base, top_base_1);
      const __m128i out = _mm_packus_epi16(out_0, out_1);
      _mm_storeu_si128((__m128i*)dst, out);
    }
  }
}